

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O3

void rlTextureParameters(uint id,int param,int value)

{
  char *text;
  
  (*glad_glBindTexture)(0xde1,id);
  if (1 < param - 0x2800U) {
    if (1 < param - 0x2802U) {
      if (param != 0x3000) goto LAB_00117c93;
      if (RLGL.ExtSupported.maxAnisotropyLevel < (float)value) {
        if (RLGL.ExtSupported.maxAnisotropyLevel <= 0.0) {
          text = "GL: Anisotropic filtering not supported";
          goto LAB_00117c87;
        }
        TraceLog(4,"GL: Maximum anisotropic filter level supported is %iX",
                 (double)RLGL.ExtSupported.maxAnisotropyLevel,(ulong)id);
      }
      (*glad_glTexParameterf)(0xde1,0x84fe,(float)value);
      goto LAB_00117c93;
    }
    if (value == 0x8742) {
      if (RLGL.ExtSupported.texMirrorClamp != true) {
        text = "GL: Clamp mirror wrap mode not supported (GL_MIRROR_CLAMP_EXT)";
LAB_00117c87:
        TraceLog(4,text);
        goto LAB_00117c93;
      }
      value = 0x8742;
    }
  }
  (*glad_glTexParameteri)(0xde1,param,value);
LAB_00117c93:
  (*glad_glBindTexture)(0xde1,0);
  return;
}

Assistant:

void rlTextureParameters(unsigned int id, int param, int value)
{
    glBindTexture(GL_TEXTURE_2D, id);

    switch (param)
    {
        case RL_TEXTURE_WRAP_S:
        case RL_TEXTURE_WRAP_T:
        {
            if (value == RL_TEXTURE_WRAP_MIRROR_CLAMP)
            {
#if !defined(GRAPHICS_API_OPENGL_11)
                if (RLGL.ExtSupported.texMirrorClamp) glTexParameteri(GL_TEXTURE_2D, param, value);
                else TRACELOG(LOG_WARNING, "GL: Clamp mirror wrap mode not supported (GL_MIRROR_CLAMP_EXT)");
#endif
            }
            else glTexParameteri(GL_TEXTURE_2D, param, value);

        } break;
        case RL_TEXTURE_MAG_FILTER:
        case RL_TEXTURE_MIN_FILTER: glTexParameteri(GL_TEXTURE_2D, param, value); break;
        case RL_TEXTURE_FILTER_ANISOTROPIC:
        {
#if !defined(GRAPHICS_API_OPENGL_11)
            if (value <= RLGL.ExtSupported.maxAnisotropyLevel) glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_MAX_ANISOTROPY_EXT, (float)value);
            else if (RLGL.ExtSupported.maxAnisotropyLevel > 0.0f)
            {
                TRACELOG(LOG_WARNING, "GL: Maximum anisotropic filter level supported is %iX", id, RLGL.ExtSupported.maxAnisotropyLevel);
                glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_MAX_ANISOTROPY_EXT, (float)value);
            }
            else TRACELOG(LOG_WARNING, "GL: Anisotropic filtering not supported");
#endif
        } break;
        default: break;
    }

    glBindTexture(GL_TEXTURE_2D, 0);
}